

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::CountSetBits_i64(w3Interp *this)

{
  uint32_t uVar1;
  uint64_t *puVar2;
  uint64_t *a;
  w3Interp *this_local;
  
  puVar2 = w3Stack::u64(&this->super_w3Stack);
  uVar1 = count_set_bits<unsigned_long>(*puVar2);
  *puVar2 = (ulong)uVar1;
  return;
}

Assistant:

INTERP (CountSetBits_i64)
{
    uint64_t& a = u64 ();
#if _MSC_VER && _M_AMD64
    a = __popcnt64 (a);
#else
    a = count_set_bits (a);
#endif
}